

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

uint32_t asm_x86_inslen(uint8_t *p)

{
  byte bVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint local_24;
  uint local_20;
  uint32_t x;
  uint32_t prefixes;
  uint32_t result;
  uint8_t *p_local;
  
  x = 0;
  local_20 = 0;
  local_24 = (uint)map_op1[*p];
  _prefixes = p;
switchD_00163bd4_default:
  switch(local_24 >> 4) {
  case 0:
    goto switchD_00163bd4_caseD_0;
  case 1:
    local_20 = local_24 | local_20;
    local_24 = (uint)map_op1[_prefixes[1]];
    x = x + 1;
    _prefixes = _prefixes + 1;
    goto switchD_00163bd4_default;
  case 2:
    local_24 = (uint)map_op2[_prefixes[1]];
    _prefixes = _prefixes + 1;
    goto switchD_00163bd4_default;
  case 3:
    _prefixes = _prefixes + 1;
    goto LAB_00163d4c;
  case 4:
    x = x - (local_20 & 2);
  case 5:
    return x + (local_24 & 0xf);
  case 6:
    if ((_prefixes[1] & 0x38) == 0) {
      if (((local_20 & 2) != 0) && (local_24 == 0x66)) {
        local_24 = 4;
      }
    }
    else {
      local_24 = 2;
    }
    goto LAB_00163d4c;
  case 7:
    uVar2 = x;
    puVar3 = _prefixes;
    if (local_24 == 0x70) {
      local_24 = _prefixes[1] & 0x1f;
      uVar2 = x + 1;
      puVar3 = _prefixes + 1;
      if (1 < local_24) {
        _prefixes = _prefixes + 3;
        x = x + 3;
        goto LAB_00163d4c;
      }
    }
    _prefixes = puVar3;
    x = uVar2;
    x = x + 1;
    local_24 = (uint)map_op2[_prefixes[2]];
    _prefixes = _prefixes + 2;
    goto switchD_00163bd4_default;
  case 8:
    x = x - (local_20 & 2);
    break;
  default:
    goto switchD_00163bd4_default;
  }
LAB_00163d4c:
  x = x + (local_24 & 0xf);
  bVar1 = _prefixes[1];
  switch(bVar1 >> 6) {
  case 0:
    if ((bVar1 & 7) == 5) {
      return x + 4;
    }
    break;
  case 1:
    x = x + 1;
    break;
  case 2:
    x = x + 4;
    break;
  case 3:
    return x;
  }
  uVar2 = x;
  if ((((bVar1 & 7) == 4) && (uVar2 = x + 1, bVar1 < 0x40)) && ((_prefixes[2] & 7) == 5)) {
    uVar2 = x + 5;
  }
  x = uVar2;
  return x;
switchD_00163bd4_caseD_0:
  return x + local_24 + (local_20 & 4);
}

Assistant:

static uint32_t asm_x86_inslen(const uint8_t* p)
{
  uint32_t result = 0;
  uint32_t prefixes = 0;
  uint32_t x = map_op1[*p];
  for (;;) {
    switch (x >> 4) {
    case 0: return result + x + (prefixes & 4);
    case 1: prefixes |= x; x = map_op1[*++p]; result++; break;
    case 2: x = map_op2[*++p]; break;
    case 3: p++; goto mrm;
    case 4: result -= (prefixes & 2);  /* fallthrough */
    case 5: return result + (x & 15);
    case 6:  /* Group 3. */
      if (p[1] & 0x38) x = 2;
      else if ((prefixes & 2) && (x == 0x66)) x = 4;
      goto mrm;
    case 7: /* VEX c4/c5. */
      if (LJ_32 && p[1] < 0xc0) {
	x = 2;
	goto mrm;
      }
      if (x == 0x70) {
	x = *++p & 0x1f;
	result++;
	if (x >= 2) {
	  p += 2;
	  result += 2;
	  goto mrm;
	}
      }
      p++;
      result++;
      x = map_op2[*++p];
      break;
    case 8: result -= (prefixes & 2);  /* fallthrough */
    case 9: mrm:  /* ModR/M and possibly SIB. */
      result += (x & 15);
      x = *++p;
      switch (x >> 6) {
      case 0: if ((x & 7) == 5) return result + 4; break;
      case 1: result++; break;
      case 2: result += 4; break;
      case 3: return result;
      }
      if ((x & 7) == 4) {
	result++;
	if (x < 0x40 && (p[1] & 7) == 5) result += 4;
      }
      return result;
    }
  }
}